

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O1

void test_arithm<int>(uint length,int value1,int value2,bool allowTrash)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var31;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var32;
  long lVar33;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var34;
  undefined8 *puVar35;
  int iVar36;
  undefined7 in_register_00000009;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var37;
  int iVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  uint uVar42;
  int iVar43;
  long lVar44;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var45;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var46;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var47;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var49;
  shared_ptr<int> pv1;
  shared_ptr<int> pv2;
  shared_ptr<int> presult;
  
  presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       (undefined4)CONCAT71(in_register_00000009,allowTrash);
  lVar44 = (long)(int)length;
  uVar39 = 0xffffffffffffffff;
  if (-1 < (int)length) {
    uVar39 = lVar44 * 4;
  }
  p_Var31 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar39);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1,p_Var31,nosimd::common::free<int>);
  pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar39);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2,
             pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<int>);
  uVar39 = 0xffffffffffffffff;
  if (-1 < (int)(length + 1)) {
    uVar39 = (long)(int)(length + 1) * 4;
  }
  pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new__(uVar39);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<int*,void(*)(int*),std::allocator<void>,void>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult,
             pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             nosimd::common::free<int>);
  uVar39 = (ulong)length;
  *(undefined4 *)
   ((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
           _vptr__Sp_counted_base + uVar39 * 4) = 0x7f;
  iVar43 = (int)length >> 2;
  p_Var32 = p_Var31;
  iVar36 = iVar43;
  iVar38 = iVar43;
  if (3 < iVar43) {
    do {
      *(int *)&p_Var32->_vptr__Sp_counted_base = value1;
      *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4) = value1;
      p_Var32->_M_use_count = value1;
      p_Var32->_M_weak_count = value1;
      *(int *)&p_Var32[1]._vptr__Sp_counted_base = value1;
      *(int *)((long)&p_Var32[1]._vptr__Sp_counted_base + 4) = value1;
      p_Var32[1]._M_use_count = value1;
      p_Var32[1]._M_weak_count = value1;
      *(int *)&p_Var32[2]._vptr__Sp_counted_base = value1;
      *(int *)((long)&p_Var32[2]._vptr__Sp_counted_base + 4) = value1;
      p_Var32[2]._M_use_count = value1;
      p_Var32[2]._M_weak_count = value1;
      *(int *)&p_Var32[3]._vptr__Sp_counted_base = value1;
      *(int *)((long)&p_Var32[3]._vptr__Sp_counted_base + 4) = value1;
      p_Var32[3]._M_use_count = value1;
      p_Var32[3]._M_weak_count = value1;
      iVar36 = iVar38 + -4;
      p_Var32 = p_Var32 + 4;
      bVar1 = 7 < iVar38;
      iVar38 = iVar36;
    } while (bVar1);
  }
  if (1 < iVar36) {
    *(int *)&p_Var32->_vptr__Sp_counted_base = value1;
    *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4) = value1;
    p_Var32->_M_use_count = value1;
    p_Var32->_M_weak_count = value1;
    *(int *)&p_Var32[1]._vptr__Sp_counted_base = value1;
    *(int *)((long)&p_Var32[1]._vptr__Sp_counted_base + 4) = value1;
    p_Var32[1]._M_use_count = value1;
    p_Var32[1]._M_weak_count = value1;
    iVar36 = iVar36 + -2;
    p_Var32 = p_Var32 + 2;
  }
  if (iVar36 != 0) {
    *(int *)&p_Var32->_vptr__Sp_counted_base = value1;
    *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4) = value1;
    p_Var32->_M_use_count = value1;
    p_Var32->_M_weak_count = value1;
  }
  uVar42 = length & 0xfffffffc;
  if (uVar42 != length) {
    lVar33 = (long)(int)uVar42;
    do {
      *(int *)((long)&p_Var31->_vptr__Sp_counted_base + lVar33 * 4) = value1;
      lVar33 = lVar33 + 1;
    } while (lVar33 < lVar44);
  }
  _Var46._vptr__Sp_counted_base._4_4_ = value2;
  _Var46._vptr__Sp_counted_base._0_4_ = value2;
  _Var46._M_use_count = value2;
  _Var46._M_weak_count = value2;
  _Var34 = pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  iVar38 = iVar43;
  iVar36 = iVar43;
  if (3 < iVar43) {
    do {
      *_Var34._M_pi = _Var46;
      _Var34._M_pi[1] = _Var46;
      _Var34._M_pi[2] = _Var46;
      _Var34._M_pi[3] = _Var46;
      iVar36 = iVar38 + -4;
      _Var34._M_pi = _Var34._M_pi + 4;
      bVar1 = 7 < iVar38;
      iVar38 = iVar36;
    } while (bVar1);
  }
  if (1 < iVar36) {
    *_Var34._M_pi = _Var46;
    _Var34._M_pi[1] = _Var46;
    iVar36 = iVar36 + -2;
    _Var34._M_pi = _Var34._M_pi + 2;
  }
  if (iVar36 != 0) {
    *_Var34._M_pi = _Var46;
  }
  if (uVar42 != length) {
    lVar33 = (long)(int)uVar42;
    do {
      *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar33 * 4) = value2;
      lVar33 = lVar33 + 1;
    } while (lVar33 < lVar44);
  }
  if (length != 0) {
    lVar33 = 0;
    do {
      if ((*(int *)((long)&p_Var31->_vptr__Sp_counted_base + lVar33 * 4) != value1) ||
         (*(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + lVar33 * 4) != value2)) {
        puVar35 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar35 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar35 + 1) = 0x1a;
        *(uint *)((long)puVar35 + 0xc) = length;
        __cxa_throw(puVar35,&Exception::typeinfo,0);
      }
      lVar33 = lVar33 + 1;
    } while (length != (uint)lVar33);
  }
  _Var34._M_pi = pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  _Var37 = pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var32 = p_Var31;
  iVar36 = iVar43;
  iVar38 = iVar43;
  if (3 < iVar43) {
    do {
      iVar36 = *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4);
      iVar2 = p_Var32->_M_use_count;
      iVar3 = p_Var32->_M_weak_count;
      iVar4 = *(int *)&p_Var32[1]._vptr__Sp_counted_base;
      iVar5 = *(int *)((long)&p_Var32[1]._vptr__Sp_counted_base + 4);
      iVar6 = p_Var32[1]._M_use_count;
      iVar7 = p_Var32[1]._M_weak_count;
      iVar8 = *(int *)&p_Var32[2]._vptr__Sp_counted_base;
      iVar9 = *(int *)((long)&p_Var32[2]._vptr__Sp_counted_base + 4);
      iVar10 = p_Var32[2]._M_use_count;
      iVar11 = p_Var32[2]._M_weak_count;
      iVar12 = *(int *)&p_Var32[3]._vptr__Sp_counted_base;
      iVar13 = *(int *)((long)&p_Var32[3]._vptr__Sp_counted_base + 4);
      iVar14 = p_Var32[3]._M_use_count;
      iVar15 = p_Var32[3]._M_weak_count;
      iVar16 = *(int *)((long)&(_Var37._M_pi)->_vptr__Sp_counted_base + 4);
      iVar17 = (_Var37._M_pi)->_M_use_count;
      iVar18 = (_Var37._M_pi)->_M_weak_count;
      iVar19 = *(int *)&_Var37._M_pi[1]._vptr__Sp_counted_base;
      iVar20 = *(int *)((long)&_Var37._M_pi[1]._vptr__Sp_counted_base + 4);
      iVar21 = _Var37._M_pi[1]._M_use_count;
      iVar22 = _Var37._M_pi[1]._M_weak_count;
      iVar23 = *(int *)&_Var37._M_pi[2]._vptr__Sp_counted_base;
      iVar24 = *(int *)((long)&_Var37._M_pi[2]._vptr__Sp_counted_base + 4);
      iVar25 = _Var37._M_pi[2]._M_use_count;
      iVar26 = _Var37._M_pi[2]._M_weak_count;
      iVar27 = *(int *)&_Var37._M_pi[3]._vptr__Sp_counted_base;
      iVar28 = *(int *)((long)&_Var37._M_pi[3]._vptr__Sp_counted_base + 4);
      iVar29 = _Var37._M_pi[3]._M_use_count;
      iVar30 = _Var37._M_pi[3]._M_weak_count;
      *(int *)&(_Var34._M_pi)->_vptr__Sp_counted_base =
           *(int *)&(_Var37._M_pi)->_vptr__Sp_counted_base +
           *(int *)&p_Var32->_vptr__Sp_counted_base;
      *(int *)((long)&(_Var34._M_pi)->_vptr__Sp_counted_base + 4) = iVar16 + iVar36;
      (_Var34._M_pi)->_M_use_count = iVar17 + iVar2;
      (_Var34._M_pi)->_M_weak_count = iVar18 + iVar3;
      *(int *)&_Var34._M_pi[1]._vptr__Sp_counted_base = iVar19 + iVar4;
      *(int *)((long)&_Var34._M_pi[1]._vptr__Sp_counted_base + 4) = iVar20 + iVar5;
      _Var34._M_pi[1]._M_use_count = iVar21 + iVar6;
      _Var34._M_pi[1]._M_weak_count = iVar22 + iVar7;
      *(int *)&_Var34._M_pi[2]._vptr__Sp_counted_base = iVar23 + iVar8;
      *(int *)((long)&_Var34._M_pi[2]._vptr__Sp_counted_base + 4) = iVar24 + iVar9;
      _Var34._M_pi[2]._M_use_count = iVar25 + iVar10;
      _Var34._M_pi[2]._M_weak_count = iVar26 + iVar11;
      *(int *)&_Var34._M_pi[3]._vptr__Sp_counted_base = iVar27 + iVar12;
      *(int *)((long)&_Var34._M_pi[3]._vptr__Sp_counted_base + 4) = iVar28 + iVar13;
      _Var34._M_pi[3]._M_use_count = iVar29 + iVar14;
      _Var34._M_pi[3]._M_weak_count = iVar30 + iVar15;
      iVar36 = iVar38 + -4;
      p_Var32 = p_Var32 + 4;
      _Var37._M_pi = _Var37._M_pi + 4;
      _Var34._M_pi = _Var34._M_pi + 4;
      bVar1 = 7 < iVar38;
      iVar38 = iVar36;
    } while (bVar1);
  }
  if (1 < iVar36) {
    iVar38 = *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4);
    iVar2 = p_Var32->_M_use_count;
    iVar3 = p_Var32->_M_weak_count;
    iVar4 = *(int *)((long)&(_Var37._M_pi)->_vptr__Sp_counted_base + 4);
    iVar5 = (_Var37._M_pi)->_M_use_count;
    iVar6 = (_Var37._M_pi)->_M_weak_count;
    *(int *)&(_Var34._M_pi)->_vptr__Sp_counted_base =
         *(int *)&(_Var37._M_pi)->_vptr__Sp_counted_base + *(int *)&p_Var32->_vptr__Sp_counted_base;
    *(int *)((long)&(_Var34._M_pi)->_vptr__Sp_counted_base + 4) = iVar4 + iVar38;
    (_Var34._M_pi)->_M_use_count = iVar5 + iVar2;
    (_Var34._M_pi)->_M_weak_count = iVar6 + iVar3;
    iVar38 = *(int *)((long)&p_Var32[1]._vptr__Sp_counted_base + 4);
    iVar2 = p_Var32[1]._M_use_count;
    iVar3 = p_Var32[1]._M_weak_count;
    iVar4 = *(int *)((long)&_Var37._M_pi[1]._vptr__Sp_counted_base + 4);
    iVar5 = _Var37._M_pi[1]._M_use_count;
    iVar6 = _Var37._M_pi[1]._M_weak_count;
    *(int *)&_Var34._M_pi[1]._vptr__Sp_counted_base =
         *(int *)&_Var37._M_pi[1]._vptr__Sp_counted_base +
         *(int *)&p_Var32[1]._vptr__Sp_counted_base;
    *(int *)((long)&_Var34._M_pi[1]._vptr__Sp_counted_base + 4) = iVar4 + iVar38;
    _Var34._M_pi[1]._M_use_count = iVar5 + iVar2;
    _Var34._M_pi[1]._M_weak_count = iVar6 + iVar3;
    iVar36 = iVar36 + -2;
    p_Var32 = p_Var32 + 2;
    _Var37._M_pi = _Var37._M_pi + 2;
    _Var34._M_pi = _Var34._M_pi + 2;
  }
  if (iVar36 != 0) {
    iVar36 = *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4);
    iVar38 = p_Var32->_M_use_count;
    iVar2 = p_Var32->_M_weak_count;
    iVar3 = *(int *)((long)&(_Var37._M_pi)->_vptr__Sp_counted_base + 4);
    iVar4 = (_Var37._M_pi)->_M_use_count;
    iVar5 = (_Var37._M_pi)->_M_weak_count;
    *(int *)&(_Var34._M_pi)->_vptr__Sp_counted_base =
         *(int *)&(_Var37._M_pi)->_vptr__Sp_counted_base + *(int *)&p_Var32->_vptr__Sp_counted_base;
    *(int *)((long)&(_Var34._M_pi)->_vptr__Sp_counted_base + 4) = iVar3 + iVar36;
    (_Var34._M_pi)->_M_use_count = iVar4 + iVar38;
    (_Var34._M_pi)->_M_weak_count = iVar5 + iVar2;
  }
  if (uVar42 != length) {
    lVar33 = (long)(int)uVar42;
    do {
      *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar33 * 4) =
           *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_vptr__Sp_counted_base + lVar33 * 4) +
           *(int *)((long)&p_Var31->_vptr__Sp_counted_base + lVar33 * 4);
      lVar33 = lVar33 + 1;
    } while (lVar33 < lVar44);
  }
  if (length != 0) {
    lVar33 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + lVar33 * 4) != value2 + value1) {
        puVar35 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar35 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar35 + 1) = 0x22;
        *(uint *)((long)puVar35 + 0xc) = length;
        __cxa_throw(puVar35,&Exception::typeinfo,0);
      }
      lVar33 = lVar33 + 1;
    } while (length != (uint)lVar33);
  }
  _Var34._M_pi = pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  _Var37 = pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var32 = p_Var31;
  iVar36 = iVar43;
  iVar38 = iVar43;
  if (3 < iVar43) {
    do {
      iVar36 = *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4);
      iVar2 = p_Var32->_M_use_count;
      iVar3 = p_Var32->_M_weak_count;
      iVar4 = *(int *)&p_Var32[1]._vptr__Sp_counted_base;
      iVar5 = *(int *)((long)&p_Var32[1]._vptr__Sp_counted_base + 4);
      iVar6 = p_Var32[1]._M_use_count;
      iVar7 = p_Var32[1]._M_weak_count;
      iVar8 = *(int *)&p_Var32[2]._vptr__Sp_counted_base;
      iVar9 = *(int *)((long)&p_Var32[2]._vptr__Sp_counted_base + 4);
      iVar10 = p_Var32[2]._M_use_count;
      iVar11 = p_Var32[2]._M_weak_count;
      iVar12 = *(int *)&p_Var32[3]._vptr__Sp_counted_base;
      iVar13 = *(int *)((long)&p_Var32[3]._vptr__Sp_counted_base + 4);
      iVar14 = p_Var32[3]._M_use_count;
      iVar15 = p_Var32[3]._M_weak_count;
      iVar16 = *(int *)((long)&(_Var37._M_pi)->_vptr__Sp_counted_base + 4);
      iVar17 = (_Var37._M_pi)->_M_use_count;
      iVar18 = (_Var37._M_pi)->_M_weak_count;
      iVar19 = *(int *)&_Var37._M_pi[1]._vptr__Sp_counted_base;
      iVar20 = *(int *)((long)&_Var37._M_pi[1]._vptr__Sp_counted_base + 4);
      iVar21 = _Var37._M_pi[1]._M_use_count;
      iVar22 = _Var37._M_pi[1]._M_weak_count;
      iVar23 = *(int *)&_Var37._M_pi[2]._vptr__Sp_counted_base;
      iVar24 = *(int *)((long)&_Var37._M_pi[2]._vptr__Sp_counted_base + 4);
      iVar25 = _Var37._M_pi[2]._M_use_count;
      iVar26 = _Var37._M_pi[2]._M_weak_count;
      iVar27 = *(int *)&_Var37._M_pi[3]._vptr__Sp_counted_base;
      iVar28 = *(int *)((long)&_Var37._M_pi[3]._vptr__Sp_counted_base + 4);
      iVar29 = _Var37._M_pi[3]._M_use_count;
      iVar30 = _Var37._M_pi[3]._M_weak_count;
      *(int *)&(_Var34._M_pi)->_vptr__Sp_counted_base =
           *(int *)&p_Var32->_vptr__Sp_counted_base -
           *(int *)&(_Var37._M_pi)->_vptr__Sp_counted_base;
      *(int *)((long)&(_Var34._M_pi)->_vptr__Sp_counted_base + 4) = iVar36 - iVar16;
      (_Var34._M_pi)->_M_use_count = iVar2 - iVar17;
      (_Var34._M_pi)->_M_weak_count = iVar3 - iVar18;
      *(int *)&_Var34._M_pi[1]._vptr__Sp_counted_base = iVar4 - iVar19;
      *(int *)((long)&_Var34._M_pi[1]._vptr__Sp_counted_base + 4) = iVar5 - iVar20;
      _Var34._M_pi[1]._M_use_count = iVar6 - iVar21;
      _Var34._M_pi[1]._M_weak_count = iVar7 - iVar22;
      *(int *)&_Var34._M_pi[2]._vptr__Sp_counted_base = iVar8 - iVar23;
      *(int *)((long)&_Var34._M_pi[2]._vptr__Sp_counted_base + 4) = iVar9 - iVar24;
      _Var34._M_pi[2]._M_use_count = iVar10 - iVar25;
      _Var34._M_pi[2]._M_weak_count = iVar11 - iVar26;
      *(int *)&_Var34._M_pi[3]._vptr__Sp_counted_base = iVar12 - iVar27;
      *(int *)((long)&_Var34._M_pi[3]._vptr__Sp_counted_base + 4) = iVar13 - iVar28;
      _Var34._M_pi[3]._M_use_count = iVar14 - iVar29;
      _Var34._M_pi[3]._M_weak_count = iVar15 - iVar30;
      iVar36 = iVar38 + -4;
      p_Var32 = p_Var32 + 4;
      _Var37._M_pi = _Var37._M_pi + 4;
      _Var34._M_pi = _Var34._M_pi + 4;
      bVar1 = 7 < iVar38;
      iVar38 = iVar36;
    } while (bVar1);
  }
  if (1 < iVar36) {
    iVar38 = *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4);
    iVar2 = p_Var32->_M_use_count;
    iVar3 = p_Var32->_M_weak_count;
    iVar4 = *(int *)((long)&(_Var37._M_pi)->_vptr__Sp_counted_base + 4);
    iVar5 = (_Var37._M_pi)->_M_use_count;
    iVar6 = (_Var37._M_pi)->_M_weak_count;
    *(int *)&(_Var34._M_pi)->_vptr__Sp_counted_base =
         *(int *)&p_Var32->_vptr__Sp_counted_base - *(int *)&(_Var37._M_pi)->_vptr__Sp_counted_base;
    *(int *)((long)&(_Var34._M_pi)->_vptr__Sp_counted_base + 4) = iVar38 - iVar4;
    (_Var34._M_pi)->_M_use_count = iVar2 - iVar5;
    (_Var34._M_pi)->_M_weak_count = iVar3 - iVar6;
    iVar38 = *(int *)((long)&p_Var32[1]._vptr__Sp_counted_base + 4);
    iVar2 = p_Var32[1]._M_use_count;
    iVar3 = p_Var32[1]._M_weak_count;
    iVar4 = *(int *)((long)&_Var37._M_pi[1]._vptr__Sp_counted_base + 4);
    iVar5 = _Var37._M_pi[1]._M_use_count;
    iVar6 = _Var37._M_pi[1]._M_weak_count;
    *(int *)&_Var34._M_pi[1]._vptr__Sp_counted_base =
         *(int *)&p_Var32[1]._vptr__Sp_counted_base -
         *(int *)&_Var37._M_pi[1]._vptr__Sp_counted_base;
    *(int *)((long)&_Var34._M_pi[1]._vptr__Sp_counted_base + 4) = iVar38 - iVar4;
    _Var34._M_pi[1]._M_use_count = iVar2 - iVar5;
    _Var34._M_pi[1]._M_weak_count = iVar3 - iVar6;
    iVar36 = iVar36 + -2;
    p_Var32 = p_Var32 + 2;
    _Var37._M_pi = _Var37._M_pi + 2;
    _Var34._M_pi = _Var34._M_pi + 2;
  }
  if (iVar36 != 0) {
    iVar36 = *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4);
    iVar38 = p_Var32->_M_use_count;
    iVar2 = p_Var32->_M_weak_count;
    iVar3 = *(int *)((long)&(_Var37._M_pi)->_vptr__Sp_counted_base + 4);
    iVar4 = (_Var37._M_pi)->_M_use_count;
    iVar5 = (_Var37._M_pi)->_M_weak_count;
    *(int *)&(_Var34._M_pi)->_vptr__Sp_counted_base =
         *(int *)&p_Var32->_vptr__Sp_counted_base - *(int *)&(_Var37._M_pi)->_vptr__Sp_counted_base;
    *(int *)((long)&(_Var34._M_pi)->_vptr__Sp_counted_base + 4) = iVar36 - iVar3;
    (_Var34._M_pi)->_M_use_count = iVar38 - iVar4;
    (_Var34._M_pi)->_M_weak_count = iVar2 - iVar5;
  }
  if (uVar42 != length) {
    lVar33 = (long)(int)uVar42;
    do {
      *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar33 * 4) =
           *(int *)((long)&p_Var31->_vptr__Sp_counted_base + lVar33 * 4) -
           *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_vptr__Sp_counted_base + lVar33 * 4);
      lVar33 = lVar33 + 1;
    } while (lVar33 < lVar44);
  }
  if (length != 0) {
    lVar33 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + lVar33 * 4) != value1 - value2) {
        puVar35 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar35 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar35 + 1) = 0x2a;
        *(uint *)((long)puVar35 + 0xc) = length;
        __cxa_throw(puVar35,&Exception::typeinfo,0);
      }
      lVar33 = lVar33 + 1;
    } while (length != (uint)lVar33);
  }
  _Var34._M_pi = pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  _Var37 = pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  p_Var32 = p_Var31;
  iVar36 = iVar43;
  iVar38 = iVar43;
  if (3 < iVar43) {
    do {
      _Var49 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])*_Var37._M_pi,(undefined1  [16])*p_Var32);
      _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])_Var37._M_pi[1],(undefined1  [16])p_Var32[1]);
      _Var47 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])_Var37._M_pi[2],(undefined1  [16])p_Var32[2]);
      _Var48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])_Var37._M_pi[3],(undefined1  [16])p_Var32[3]);
      *_Var34._M_pi = _Var49;
      _Var34._M_pi[1] = _Var45;
      _Var34._M_pi[2] = _Var47;
      _Var34._M_pi[3] = _Var48;
      iVar36 = iVar38 + -4;
      p_Var32 = p_Var32 + 4;
      _Var37._M_pi = _Var37._M_pi + 4;
      _Var34._M_pi = _Var34._M_pi + 4;
      bVar1 = 7 < iVar38;
      iVar38 = iVar36;
    } while (bVar1);
  }
  if (1 < iVar36) {
    _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             pmulld((undefined1  [16])*_Var37._M_pi,(undefined1  [16])*p_Var32);
    *_Var34._M_pi = _Var45;
    _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             pmulld((undefined1  [16])_Var37._M_pi[1],(undefined1  [16])p_Var32[1]);
    _Var34._M_pi[1] = _Var45;
    iVar36 = iVar36 + -2;
    p_Var32 = p_Var32 + 2;
    _Var37._M_pi = _Var37._M_pi + 2;
    _Var34._M_pi = _Var34._M_pi + 2;
  }
  if (iVar36 != 0) {
    _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             pmulld((undefined1  [16])*_Var37._M_pi,(undefined1  [16])*p_Var32);
    *_Var34._M_pi = _Var45;
  }
  if (uVar42 != length) {
    lVar33 = (long)(int)uVar42;
    do {
      *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar33 * 4) =
           *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                           _M_pi)->_vptr__Sp_counted_base + lVar33 * 4) *
           *(int *)((long)&p_Var31->_vptr__Sp_counted_base + lVar33 * 4);
      lVar33 = lVar33 + 1;
    } while (lVar33 < lVar44);
  }
  if (length != 0) {
    lVar33 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + lVar33 * 4) != value2 * value1) {
        puVar35 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar35 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar35 + 1) = 0x32;
        *(uint *)((long)puVar35 + 0xc) = length;
        __cxa_throw(puVar35,&Exception::typeinfo,0);
      }
      lVar33 = lVar33 + 1;
    } while (length != (uint)lVar33);
  }
  uVar41 = (long)value1 % (long)value2 & 0xffffffff;
  if (p_Var31 == pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar40 = 0;
      do {
        iVar36 = *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar40 * 4);
        iVar38 = *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar40 * 4);
        uVar41 = (long)iVar36 % (long)iVar38 & 0xffffffff;
        *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + uVar40 * 4) = iVar36 / iVar38;
        uVar40 = uVar40 + 1;
      } while (uVar39 != uVar40);
    }
  }
  else if (0 < (int)length) {
    uVar40 = 0;
    do {
      iVar36 = *(int *)((long)&p_Var31->_vptr__Sp_counted_base + uVar40 * 4);
      iVar38 = *(int *)((long)&(pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                               _M_pi)->_vptr__Sp_counted_base + uVar40 * 4);
      uVar41 = (long)iVar36 % (long)iVar38 & 0xffffffff;
      *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + uVar40 * 4) = iVar36 / iVar38;
      uVar40 = uVar40 + 1;
    } while (uVar39 != uVar40);
  }
  if (length != 0) {
    lVar33 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + lVar33 * 4) != value1 / value2) {
        puVar35 = (undefined8 *)
                  __cxa_allocate_exception
                            (0x10,pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi,uVar41);
        *puVar35 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar35 + 1) = 0x3a;
        *(uint *)((long)puVar35 + 0xc) = length;
        __cxa_throw(puVar35,&Exception::typeinfo,0);
      }
      lVar33 = lVar33 + 1;
    } while (length != (uint)lVar33);
  }
  _Var34._M_pi = pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var32 = p_Var31;
  iVar36 = iVar43;
  iVar38 = iVar43;
  if (3 < iVar43) {
    do {
      iVar36 = *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4);
      iVar2 = p_Var32->_M_use_count;
      iVar3 = p_Var32->_M_weak_count;
      *(int *)&(_Var34._M_pi)->_vptr__Sp_counted_base =
           *(int *)&p_Var32->_vptr__Sp_counted_base + value2;
      *(int *)((long)&(_Var34._M_pi)->_vptr__Sp_counted_base + 4) = iVar36 + value2;
      (_Var34._M_pi)->_M_use_count = iVar2 + value2;
      (_Var34._M_pi)->_M_weak_count = iVar3 + value2;
      iVar36 = *(int *)((long)&p_Var32[1]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var32[1]._M_use_count;
      iVar3 = p_Var32[1]._M_weak_count;
      *(int *)&_Var34._M_pi[1]._vptr__Sp_counted_base =
           *(int *)&p_Var32[1]._vptr__Sp_counted_base + value2;
      *(int *)((long)&_Var34._M_pi[1]._vptr__Sp_counted_base + 4) = iVar36 + value2;
      _Var34._M_pi[1]._M_use_count = iVar2 + value2;
      _Var34._M_pi[1]._M_weak_count = iVar3 + value2;
      iVar36 = *(int *)((long)&p_Var32[2]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var32[2]._M_use_count;
      iVar3 = p_Var32[2]._M_weak_count;
      *(int *)&_Var34._M_pi[2]._vptr__Sp_counted_base =
           *(int *)&p_Var32[2]._vptr__Sp_counted_base + value2;
      *(int *)((long)&_Var34._M_pi[2]._vptr__Sp_counted_base + 4) = iVar36 + value2;
      _Var34._M_pi[2]._M_use_count = iVar2 + value2;
      _Var34._M_pi[2]._M_weak_count = iVar3 + value2;
      iVar36 = *(int *)((long)&p_Var32[3]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var32[3]._M_use_count;
      iVar3 = p_Var32[3]._M_weak_count;
      *(int *)&_Var34._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&p_Var32[3]._vptr__Sp_counted_base + value2;
      *(int *)((long)&_Var34._M_pi[3]._vptr__Sp_counted_base + 4) = iVar36 + value2;
      _Var34._M_pi[3]._M_use_count = iVar2 + value2;
      _Var34._M_pi[3]._M_weak_count = iVar3 + value2;
      iVar36 = iVar38 + -4;
      p_Var32 = p_Var32 + 4;
      _Var34._M_pi = _Var34._M_pi + 4;
      bVar1 = 7 < iVar38;
      iVar38 = iVar36;
    } while (bVar1);
  }
  if (1 < iVar36) {
    iVar38 = *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4);
    iVar2 = p_Var32->_M_use_count;
    iVar3 = p_Var32->_M_weak_count;
    *(int *)&(_Var34._M_pi)->_vptr__Sp_counted_base =
         *(int *)&p_Var32->_vptr__Sp_counted_base + value2;
    *(int *)((long)&(_Var34._M_pi)->_vptr__Sp_counted_base + 4) = iVar38 + value2;
    (_Var34._M_pi)->_M_use_count = iVar2 + value2;
    (_Var34._M_pi)->_M_weak_count = iVar3 + value2;
    iVar38 = *(int *)((long)&p_Var32[1]._vptr__Sp_counted_base + 4);
    iVar2 = p_Var32[1]._M_use_count;
    iVar3 = p_Var32[1]._M_weak_count;
    *(int *)&_Var34._M_pi[1]._vptr__Sp_counted_base =
         *(int *)&p_Var32[1]._vptr__Sp_counted_base + value2;
    *(int *)((long)&_Var34._M_pi[1]._vptr__Sp_counted_base + 4) = iVar38 + value2;
    _Var34._M_pi[1]._M_use_count = iVar2 + value2;
    _Var34._M_pi[1]._M_weak_count = iVar3 + value2;
    iVar36 = iVar36 + -2;
    p_Var32 = p_Var32 + 2;
    _Var34._M_pi = _Var34._M_pi + 2;
  }
  if (iVar36 != 0) {
    iVar36 = *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4);
    iVar38 = p_Var32->_M_use_count;
    iVar2 = p_Var32->_M_weak_count;
    *(int *)&(_Var34._M_pi)->_vptr__Sp_counted_base =
         *(int *)&p_Var32->_vptr__Sp_counted_base + value2;
    *(int *)((long)&(_Var34._M_pi)->_vptr__Sp_counted_base + 4) = iVar36 + value2;
    (_Var34._M_pi)->_M_use_count = iVar38 + value2;
    (_Var34._M_pi)->_M_weak_count = iVar2 + value2;
  }
  if (uVar42 != length) {
    lVar33 = (long)(int)uVar42;
    do {
      *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar33 * 4) =
           *(int *)((long)&p_Var31->_vptr__Sp_counted_base + lVar33 * 4) + value2;
      lVar33 = lVar33 + 1;
    } while (lVar33 < lVar44);
  }
  if (length != 0) {
    lVar33 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + lVar33 * 4) != value2 + value1) {
        puVar35 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar35 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar35 + 1) = 0x43;
        *(uint *)((long)puVar35 + 0xc) = length;
        __cxa_throw(puVar35,&Exception::typeinfo,0);
      }
      lVar33 = lVar33 + 1;
    } while (length != (uint)lVar33);
  }
  _Var34._M_pi = pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var32 = p_Var31;
  iVar38 = iVar43;
  iVar36 = iVar43;
  if (3 < iVar43) {
    do {
      iVar36 = *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4);
      iVar2 = p_Var32->_M_use_count;
      iVar3 = p_Var32->_M_weak_count;
      *(int *)&(_Var34._M_pi)->_vptr__Sp_counted_base =
           *(int *)&p_Var32->_vptr__Sp_counted_base - value2;
      *(int *)((long)&(_Var34._M_pi)->_vptr__Sp_counted_base + 4) = iVar36 - value2;
      (_Var34._M_pi)->_M_use_count = iVar2 - value2;
      (_Var34._M_pi)->_M_weak_count = iVar3 - value2;
      iVar36 = *(int *)((long)&p_Var32[1]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var32[1]._M_use_count;
      iVar3 = p_Var32[1]._M_weak_count;
      *(int *)&_Var34._M_pi[1]._vptr__Sp_counted_base =
           *(int *)&p_Var32[1]._vptr__Sp_counted_base - value2;
      *(int *)((long)&_Var34._M_pi[1]._vptr__Sp_counted_base + 4) = iVar36 - value2;
      _Var34._M_pi[1]._M_use_count = iVar2 - value2;
      _Var34._M_pi[1]._M_weak_count = iVar3 - value2;
      iVar36 = *(int *)((long)&p_Var32[2]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var32[2]._M_use_count;
      iVar3 = p_Var32[2]._M_weak_count;
      *(int *)&_Var34._M_pi[2]._vptr__Sp_counted_base =
           *(int *)&p_Var32[2]._vptr__Sp_counted_base - value2;
      *(int *)((long)&_Var34._M_pi[2]._vptr__Sp_counted_base + 4) = iVar36 - value2;
      _Var34._M_pi[2]._M_use_count = iVar2 - value2;
      _Var34._M_pi[2]._M_weak_count = iVar3 - value2;
      iVar36 = *(int *)((long)&p_Var32[3]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var32[3]._M_use_count;
      iVar3 = p_Var32[3]._M_weak_count;
      *(int *)&_Var34._M_pi[3]._vptr__Sp_counted_base =
           *(int *)&p_Var32[3]._vptr__Sp_counted_base - value2;
      *(int *)((long)&_Var34._M_pi[3]._vptr__Sp_counted_base + 4) = iVar36 - value2;
      _Var34._M_pi[3]._M_use_count = iVar2 - value2;
      _Var34._M_pi[3]._M_weak_count = iVar3 - value2;
      iVar36 = iVar38 + -4;
      p_Var32 = p_Var32 + 4;
      _Var34._M_pi = _Var34._M_pi + 4;
      bVar1 = 7 < iVar38;
      iVar38 = iVar36;
    } while (bVar1);
  }
  if (1 < iVar36) {
    iVar38 = *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4);
    iVar2 = p_Var32->_M_use_count;
    iVar3 = p_Var32->_M_weak_count;
    *(int *)&(_Var34._M_pi)->_vptr__Sp_counted_base =
         *(int *)&p_Var32->_vptr__Sp_counted_base - value2;
    *(int *)((long)&(_Var34._M_pi)->_vptr__Sp_counted_base + 4) = iVar38 - value2;
    (_Var34._M_pi)->_M_use_count = iVar2 - value2;
    (_Var34._M_pi)->_M_weak_count = iVar3 - value2;
    iVar38 = *(int *)((long)&p_Var32[1]._vptr__Sp_counted_base + 4);
    iVar2 = p_Var32[1]._M_use_count;
    iVar3 = p_Var32[1]._M_weak_count;
    *(int *)&_Var34._M_pi[1]._vptr__Sp_counted_base =
         *(int *)&p_Var32[1]._vptr__Sp_counted_base - value2;
    *(int *)((long)&_Var34._M_pi[1]._vptr__Sp_counted_base + 4) = iVar38 - value2;
    _Var34._M_pi[1]._M_use_count = iVar2 - value2;
    _Var34._M_pi[1]._M_weak_count = iVar3 - value2;
    iVar36 = iVar36 + -2;
    p_Var32 = p_Var32 + 2;
    _Var34._M_pi = _Var34._M_pi + 2;
  }
  if (iVar36 != 0) {
    iVar36 = *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4);
    iVar38 = p_Var32->_M_use_count;
    iVar2 = p_Var32->_M_weak_count;
    *(int *)&(_Var34._M_pi)->_vptr__Sp_counted_base =
         *(int *)&p_Var32->_vptr__Sp_counted_base - value2;
    *(int *)((long)&(_Var34._M_pi)->_vptr__Sp_counted_base + 4) = iVar36 - value2;
    (_Var34._M_pi)->_M_use_count = iVar38 - value2;
    (_Var34._M_pi)->_M_weak_count = iVar2 - value2;
  }
  if (uVar42 != length) {
    lVar33 = (long)(int)uVar42;
    do {
      *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar33 * 4) =
           *(int *)((long)&p_Var31->_vptr__Sp_counted_base + lVar33 * 4) - value2;
      lVar33 = lVar33 + 1;
    } while (lVar33 < lVar44);
  }
  if (length != 0) {
    lVar33 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + lVar33 * 4) != value1 - value2) {
        puVar35 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar35 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar35 + 1) = 0x4b;
        *(uint *)((long)puVar35 + 0xc) = length;
        __cxa_throw(puVar35,&Exception::typeinfo,0);
      }
      lVar33 = lVar33 + 1;
    } while (length != (uint)lVar33);
  }
  _Var34._M_pi = pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var32 = p_Var31;
  iVar38 = iVar43;
  iVar36 = iVar43;
  if (3 < iVar43) {
    do {
      iVar36 = *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4);
      iVar2 = p_Var32->_M_use_count;
      iVar3 = p_Var32->_M_weak_count;
      *(int *)&(_Var34._M_pi)->_vptr__Sp_counted_base =
           value2 - *(int *)&p_Var32->_vptr__Sp_counted_base;
      *(int *)((long)&(_Var34._M_pi)->_vptr__Sp_counted_base + 4) = value2 - iVar36;
      (_Var34._M_pi)->_M_use_count = value2 - iVar2;
      (_Var34._M_pi)->_M_weak_count = value2 - iVar3;
      iVar36 = *(int *)((long)&p_Var32[1]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var32[1]._M_use_count;
      iVar3 = p_Var32[1]._M_weak_count;
      *(int *)&_Var34._M_pi[1]._vptr__Sp_counted_base =
           value2 - *(int *)&p_Var32[1]._vptr__Sp_counted_base;
      *(int *)((long)&_Var34._M_pi[1]._vptr__Sp_counted_base + 4) = value2 - iVar36;
      _Var34._M_pi[1]._M_use_count = value2 - iVar2;
      _Var34._M_pi[1]._M_weak_count = value2 - iVar3;
      iVar36 = *(int *)((long)&p_Var32[2]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var32[2]._M_use_count;
      iVar3 = p_Var32[2]._M_weak_count;
      *(int *)&_Var34._M_pi[2]._vptr__Sp_counted_base =
           value2 - *(int *)&p_Var32[2]._vptr__Sp_counted_base;
      *(int *)((long)&_Var34._M_pi[2]._vptr__Sp_counted_base + 4) = value2 - iVar36;
      _Var34._M_pi[2]._M_use_count = value2 - iVar2;
      _Var34._M_pi[2]._M_weak_count = value2 - iVar3;
      iVar36 = *(int *)((long)&p_Var32[3]._vptr__Sp_counted_base + 4);
      iVar2 = p_Var32[3]._M_use_count;
      iVar3 = p_Var32[3]._M_weak_count;
      *(int *)&_Var34._M_pi[3]._vptr__Sp_counted_base =
           value2 - *(int *)&p_Var32[3]._vptr__Sp_counted_base;
      *(int *)((long)&_Var34._M_pi[3]._vptr__Sp_counted_base + 4) = value2 - iVar36;
      _Var34._M_pi[3]._M_use_count = value2 - iVar2;
      _Var34._M_pi[3]._M_weak_count = value2 - iVar3;
      iVar36 = iVar38 + -4;
      p_Var32 = p_Var32 + 4;
      _Var34._M_pi = _Var34._M_pi + 4;
      bVar1 = 7 < iVar38;
      iVar38 = iVar36;
    } while (bVar1);
  }
  if (1 < iVar36) {
    iVar38 = *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4);
    iVar2 = p_Var32->_M_use_count;
    iVar3 = p_Var32->_M_weak_count;
    *(int *)&(_Var34._M_pi)->_vptr__Sp_counted_base =
         value2 - *(int *)&p_Var32->_vptr__Sp_counted_base;
    *(int *)((long)&(_Var34._M_pi)->_vptr__Sp_counted_base + 4) = value2 - iVar38;
    (_Var34._M_pi)->_M_use_count = value2 - iVar2;
    (_Var34._M_pi)->_M_weak_count = value2 - iVar3;
    iVar38 = *(int *)((long)&p_Var32[1]._vptr__Sp_counted_base + 4);
    iVar2 = p_Var32[1]._M_use_count;
    iVar3 = p_Var32[1]._M_weak_count;
    *(int *)&_Var34._M_pi[1]._vptr__Sp_counted_base =
         value2 - *(int *)&p_Var32[1]._vptr__Sp_counted_base;
    *(int *)((long)&_Var34._M_pi[1]._vptr__Sp_counted_base + 4) = value2 - iVar38;
    _Var34._M_pi[1]._M_use_count = value2 - iVar2;
    _Var34._M_pi[1]._M_weak_count = value2 - iVar3;
    iVar36 = iVar36 + -2;
    p_Var32 = p_Var32 + 2;
    _Var34._M_pi = _Var34._M_pi + 2;
  }
  if (iVar36 != 0) {
    iVar36 = *(int *)((long)&p_Var32->_vptr__Sp_counted_base + 4);
    iVar38 = p_Var32->_M_use_count;
    iVar2 = p_Var32->_M_weak_count;
    *(int *)&(_Var34._M_pi)->_vptr__Sp_counted_base =
         value2 - *(int *)&p_Var32->_vptr__Sp_counted_base;
    *(int *)((long)&(_Var34._M_pi)->_vptr__Sp_counted_base + 4) = value2 - iVar36;
    (_Var34._M_pi)->_M_use_count = value2 - iVar38;
    (_Var34._M_pi)->_M_weak_count = value2 - iVar2;
  }
  if (uVar42 != length) {
    lVar33 = (long)(int)uVar42;
    do {
      *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + lVar33 * 4) =
           value2 - *(int *)((long)&p_Var31->_vptr__Sp_counted_base + lVar33 * 4);
      lVar33 = lVar33 + 1;
    } while (lVar33 < lVar44);
  }
  if (length != 0) {
    lVar33 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + lVar33 * 4) != value2 - value1) {
        puVar35 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar35 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar35 + 1) = 0x53;
        *(uint *)((long)puVar35 + 0xc) = length;
        __cxa_throw(puVar35,&Exception::typeinfo,0);
      }
      lVar33 = lVar33 + 1;
    } while (length != (uint)lVar33);
  }
  _Var34._M_pi = pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  p_Var32 = p_Var31;
  iVar36 = iVar43;
  if (3 < iVar43) {
    do {
      _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])*p_Var32,(undefined1  [16])_Var46);
      *_Var34._M_pi = _Var45;
      _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])p_Var32[1],(undefined1  [16])_Var46);
      _Var34._M_pi[1] = _Var45;
      _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])p_Var32[2],(undefined1  [16])_Var46);
      _Var34._M_pi[2] = _Var45;
      _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
               pmulld((undefined1  [16])p_Var32[3],(undefined1  [16])_Var46);
      _Var34._M_pi[3] = _Var45;
      iVar36 = iVar43 + -4;
      p_Var32 = p_Var32 + 4;
      _Var34._M_pi = _Var34._M_pi + 4;
      bVar1 = 7 < iVar43;
      iVar43 = iVar36;
    } while (bVar1);
  }
  if (1 < iVar36) {
    _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             pmulld((undefined1  [16])*p_Var32,(undefined1  [16])_Var46);
    *_Var34._M_pi = _Var45;
    _Var45 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             pmulld((undefined1  [16])p_Var32[1],(undefined1  [16])_Var46);
    _Var34._M_pi[1] = _Var45;
    iVar36 = iVar36 + -2;
    p_Var32 = p_Var32 + 2;
    _Var34._M_pi = _Var34._M_pi + 2;
  }
  if (iVar36 != 0) {
    _Var46 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             pmulld((undefined1  [16])*p_Var32,(undefined1  [16])_Var46);
    *_Var34._M_pi = _Var46;
  }
  if (uVar42 != length) {
    lVar33 = (long)(int)uVar42;
    do {
      uVar42 = *(int *)((long)&p_Var31->_vptr__Sp_counted_base + lVar33 * 4) * value2;
      p_Var32 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar42;
      *(uint *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                       _vptr__Sp_counted_base + lVar33 * 4) = uVar42;
      lVar33 = lVar33 + 1;
    } while (lVar33 < lVar44);
  }
  if (length != 0) {
    lVar44 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + lVar44 * 4) != value2 * value1) {
        puVar35 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar35 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar35 + 1) = 0x5b;
        *(uint *)((long)puVar35 + 0xc) = length;
        __cxa_throw(puVar35,&Exception::typeinfo,0);
      }
      lVar44 = lVar44 + 1;
    } while (length != (uint)lVar44);
  }
  if (p_Var31 == pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi) {
    if (0 < (int)length) {
      uVar41 = 0;
      do {
        iVar36 = *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar41 * 4);
        p_Var32 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  ((long)iVar36 % (long)value2 & 0xffffffff);
        *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                        ->_vptr__Sp_counted_base + uVar41 * 4) = iVar36 / value2;
        uVar41 = uVar41 + 1;
      } while (uVar39 != uVar41);
    }
  }
  else if (0 < (int)length) {
    uVar41 = 0;
    do {
      iVar36 = *(int *)((long)&p_Var31->_vptr__Sp_counted_base + uVar41 * 4);
      p_Var32 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                ((long)iVar36 % (long)value2 & 0xffffffff);
      *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + uVar41 * 4) = iVar36 / value2;
      uVar41 = uVar41 + 1;
    } while (uVar39 != uVar41);
  }
  if (length != 0) {
    lVar44 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + lVar44 * 4) != value1 / value2) {
        puVar35 = (undefined8 *)
                  __cxa_allocate_exception
                            (0x10,pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi,p_Var32);
        *puVar35 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar35 + 1) = 99;
        *(uint *)((long)puVar35 + 0xc) = length;
        __cxa_throw(puVar35,&Exception::typeinfo,0);
      }
      lVar44 = lVar44 + 1;
    } while (length != (uint)lVar44);
  }
  if (0 < (int)length) {
    uVar41 = 0;
    do {
      *(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                      _vptr__Sp_counted_base + uVar41 * 4) =
           value2 / *(int *)((long)&p_Var31->_vptr__Sp_counted_base + uVar41 * 4);
      uVar41 = uVar41 + 1;
    } while (uVar39 != uVar41);
  }
  if (length != 0) {
    lVar44 = 0;
    do {
      if (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                          )->_vptr__Sp_counted_base + lVar44 * 4) != value2 / value1) {
        puVar35 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar35 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
        *(undefined4 *)(puVar35 + 1) = 0x6b;
        *(uint *)((long)puVar35 + 0xc) = length;
        __cxa_throw(puVar35,&Exception::typeinfo,0);
      }
      lVar44 = lVar44 + 1;
    } while (length != (uint)lVar44);
  }
  if ((presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_1_ == '\0')
     && (*(int *)((long)&(pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                         ->_vptr__Sp_counted_base + uVar39 * 4) != 0x7f)) {
    puVar35 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar35 = "void test_arithm(unsigned int, T, T, bool) [T = int]";
    *(undefined4 *)(puVar35 + 1) = 0x70;
    *(uint *)((long)puVar35 + 0xc) = length;
    __cxa_throw(puVar35,&Exception::typeinfo,0);
  }
  if (presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               presult.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  if (pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               pv1.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}